

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void addfield(lua_State *L,luaL_Buffer *b,int i)

{
  int iVar1;
  char *pcVar2;
  
  lua_rawgeti(L,1,i);
  pcVar2 = "no value";
  if ((Node *)L->top != &dummynode_) {
    iVar1 = *(int *)((long)&((Node *)L->top)[-1].i_key + 0x10);
    if (0xfffffffd < iVar1 - 5U) {
      luaL_addvalue(b);
      return;
    }
    if (iVar1 != -1) {
      pcVar2 = luaT_typenames[iVar1];
    }
  }
  luaL_error(L,"invalid value (%s) at index %d in table for \'concat\'",pcVar2,(ulong)(uint)i);
}

Assistant:

static void addfield(lua_State*L,luaL_Buffer*b,int i){
lua_rawgeti(L,1,i);
if(!lua_isstring(L,-1))
luaL_error(L,"invalid value (%s) at index %d in table for "
LUA_QL("concat"),luaL_typename(L,-1),i);
luaL_addvalue(b);
}